

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

Status __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::load(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             **matrix,int dm)

{
  U *pUVar1;
  Col *pCVar2;
  shared_ptr<soplex::Tolerances> *psVar3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  undefined8 uVar5;
  Real RVar6;
  int iVar7;
  bool bVar8;
  type_conflict5 tVar9;
  bool bVar10;
  SPxOut *pSVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *th;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *th_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *th_01;
  fpclass_type fVar12;
  int iVar13;
  cpp_dec_float<50U,_int,_void> *b;
  int32_t iVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_318 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_310;
  uint local_308 [3];
  undefined3 uStack_2fb;
  uint local_2f8;
  undefined3 uStack_2f3;
  int local_2f0;
  bool local_2ec;
  undefined8 local_2e8;
  cpp_dec_float<50U,_int,_void> *local_2e0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2d8;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **local_2d0;
  uint local_2c8 [2];
  uint auStack_2c0 [2];
  uint local_2b8 [2];
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined1 local_2a0 [56];
  Tolerances *local_268;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_260;
  uint local_258 [2];
  uint auStack_250 [2];
  uint local_248 [2];
  int local_240;
  bool local_23c;
  fpclass_type local_238;
  int32_t local_234;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  int local_200;
  undefined1 local_1fc;
  fpclass_type local_1f8;
  int32_t local_1f4;
  soplex local_1e8 [8];
  uint auStack_1e0 [2];
  uint local_1d8 [2];
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  int local_1c0;
  undefined1 local_1bc;
  fpclass_type local_1b8;
  int32_t local_1b4;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  int local_180;
  undefined1 local_17c;
  fpclass_type local_178;
  int32_t local_174;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  longlong local_a8;
  cpp_dec_float<50U,_int,_void> local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lastStability;
  
  local_2d0 = matrix;
  (*(this->
    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SLinSolver[6])(&lastStability,this);
  pUVar1 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).u;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.list.next = (Dring *)pUVar1;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.list.prev = (Dring *)pUVar1;
  pCVar2 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).u.col;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.list.next = &pCVar2->list;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.list.prev = &pCVar2->list;
  this->usetup = false;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.updateType = this->uptype;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.firstUpdate = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.firstUnused = 0;
  if ((this->
      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedim == dm) {
    local_318 = (undefined1  [8])0x4000000000000000;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems._24_5_ = 0;
    result.m_backend.data._M_elems[7]._1_3_ = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend.data._M_elems[9]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&result.m_backend,&(this->minStability).m_backend,(double *)local_318);
    tVar9 = boost::multiprecision::operator>
                      (&lastStability,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result.m_backend);
    if (tVar9) {
      local_2a8 = *(undefined8 *)((this->minThreshold).m_backend.data._M_elems + 8);
      local_2c8 = *(uint (*) [2])(this->minThreshold).m_backend.data._M_elems;
      auStack_2c0 = *(uint (*) [2])((this->minThreshold).m_backend.data._M_elems + 2);
      local_2b8 = *(uint (*) [2])((this->minThreshold).m_backend.data._M_elems + 4);
      uStack_2b0 = *(undefined8 *)((this->minThreshold).m_backend.data._M_elems + 6);
      iVar13 = (this->minThreshold).m_backend.exp;
      bVar10 = (this->minThreshold).m_backend.neg;
      fVar12 = (this->minThreshold).m_backend.fpclass;
      iVar14 = (this->minThreshold).m_backend.prec_elem;
      local_1a8 = *(undefined8 *)(this->minThreshold).m_backend.data._M_elems;
      uStack_1a0 = *(undefined8 *)((this->minThreshold).m_backend.data._M_elems + 2);
      local_198 = *(undefined8 *)((this->minThreshold).m_backend.data._M_elems + 4);
      uStack_190 = *(undefined8 *)((this->minThreshold).m_backend.data._M_elems + 6);
      local_188 = *(undefined8 *)((this->minThreshold).m_backend.data._M_elems + 8);
      psVar3 = &(this->
                super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances;
      local_180 = iVar13;
      local_17c = bVar10;
      local_178 = fVar12;
      local_174 = iVar14;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_318,
                 &psVar3->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar6 = Tolerances::epsilon((Tolerances *)local_318);
      betterThreshold<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,(soplex *)&local_1a8,th,RVar6);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_310);
      while (tVar9 = boost::multiprecision::operator<(&result,&this->lastThreshold),
            bVar8 = result.m_backend.neg, iVar7 = result.m_backend.exp, tVar9) {
        local_2a8 = CONCAT35(result.m_backend.data._M_elems[9]._1_3_,
                             result.m_backend.data._M_elems._32_5_);
        uStack_2b0 = CONCAT35(result.m_backend.data._M_elems[7]._1_3_,
                              result.m_backend.data._M_elems._24_5_);
        local_2b8[0] = result.m_backend.data._M_elems[4];
        local_2b8[1] = result.m_backend.data._M_elems[5];
        local_2c8[0] = result.m_backend.data._M_elems[0];
        local_2c8[1] = result.m_backend.data._M_elems[1];
        auStack_2c0[0] = result.m_backend.data._M_elems[2];
        auStack_2c0[1] = result.m_backend.data._M_elems[3];
        fVar12 = result.m_backend.fpclass;
        iVar14 = result.m_backend.prec_elem;
        local_1e8 = (soplex  [8])result.m_backend.data._M_elems._0_8_;
        auStack_1e0[0] = result.m_backend.data._M_elems[2];
        auStack_1e0[1] = result.m_backend.data._M_elems[3];
        local_1d8[0] = result.m_backend.data._M_elems[4];
        local_1d8[1] = result.m_backend.data._M_elems[5];
        local_1c0 = result.m_backend.exp;
        local_1bc = result.m_backend.neg;
        local_1b8 = result.m_backend.fpclass;
        local_1b4 = result.m_backend.prec_elem;
        uStack_1d0 = uStack_2b0;
        local_1c8 = local_2a8;
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_2a0,
                   &psVar3->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar6 = Tolerances::epsilon((Tolerances *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_));
        betterThreshold<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_318,local_1e8,th_00,RVar6);
        result.m_backend.data._M_elems._32_5_ = _local_2f8;
        result.m_backend.data._M_elems[9]._1_3_ = uStack_2f3;
        result.m_backend.data._M_elems[4] = local_308[0];
        result.m_backend.data._M_elems[5] = local_308[1];
        result.m_backend.data._M_elems._24_5_ = stack0xfffffffffffffd00;
        result.m_backend.data._M_elems[7]._1_3_ = uStack_2fb;
        result.m_backend.data._M_elems[0] = local_318._0_4_;
        result.m_backend.data._M_elems[1] = local_318._4_4_;
        result.m_backend.data._M_elems._8_8_ = _Stack_310._M_pi;
        result.m_backend.exp = local_2f0;
        result.m_backend.neg = local_2ec;
        result.m_backend.fpclass = (fpclass_type)local_2e8;
        result.m_backend.prec_elem = local_2e8._4_4_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2a0 + 8));
        iVar13 = iVar7;
        bVar10 = bVar8;
      }
      *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 8) = local_2a8;
      *(uint (*) [2])((this->lastThreshold).m_backend.data._M_elems + 4) = local_2b8;
      *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 6) = uStack_2b0;
      *(uint (*) [2])(this->lastThreshold).m_backend.data._M_elems = local_2c8;
      *(uint (*) [2])((this->lastThreshold).m_backend.data._M_elems + 2) = auStack_2c0;
      (this->lastThreshold).m_backend.exp = iVar13;
      (this->lastThreshold).m_backend.neg = bVar10;
      (this->lastThreshold).m_backend.fpclass = fVar12;
      (this->lastThreshold).m_backend.prec_elem = iVar14;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_2a0,0.04,(type *)0x0);
      local_2e8._0_4_ = cpp_dec_float_finite;
      local_2e8._4_4_ = 10;
      local_318 = (undefined1  [8])0x0;
      _Stack_310._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_308[0] = 0;
      local_308[1] = 0;
      stack0xfffffffffffffd00 = 0;
      uStack_2fb = 0;
      _local_2f8 = 0;
      uStack_2f3 = 0;
      local_2f0 = 0;
      local_2ec = false;
      local_a8 = 2;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                ((cpp_dec_float<50U,_int,_void> *)local_318,
                 (cpp_dec_float<50U,_int,_void> *)local_2a0,&local_a8);
      *(ulong *)((this->minStability).m_backend.data._M_elems + 8) = CONCAT35(uStack_2f3,_local_2f8)
      ;
      *(undefined8 *)((this->minStability).m_backend.data._M_elems + 4) = local_308._0_8_;
      *(ulong *)((this->minStability).m_backend.data._M_elems + 6) =
           CONCAT35(uStack_2fb,stack0xfffffffffffffd00);
      *(undefined1 (*) [8])(this->minStability).m_backend.data._M_elems = local_318;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((this->minStability).m_backend.data._M_elems + 2) = _Stack_310._M_pi;
      (this->minStability).m_backend.exp = local_2f0;
      (this->minStability).m_backend.neg = local_2ec;
      (this->minStability).m_backend.fpclass = (fpclass_type)local_2e8;
      (this->minStability).m_backend.prec_elem = local_2e8._4_4_;
    }
  }
  else {
    (*(this->
      super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SLinSolver[2])(this);
    (this->
    super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedim = dm;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->vec,dm,true);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->ssvec,
            (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedim);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->eta,
            (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedim);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->forest,
            (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedim);
    (this->
    super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).work = (this->vec).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).row.perm,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).row.orig,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).col.perm,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).col.orig,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim);
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::resize(&(this->
              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).diag,(long)(this->
                           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).thedim);
    spx_realloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Dring*>
              (&(this->
                super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).u.row.elem,
               (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedim);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).u.row.len,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim + 1);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).u.row.max,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim + 1);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).u.row.start,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim + 1);
    spx_realloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Dring*>
              (&(this->
                super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).u.col.elem,
               (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedim);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).u.col.len,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim + 1);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).u.col.max,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim + 1);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).u.col.start,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim + 1);
    iVar13 = (this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedim + 1000;
    (this->
    super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).l.startSize = iVar13;
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).l.row,iVar13);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).l.start,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).l.startSize);
  }
  iVar13 = (this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedim;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.list.idx = iVar13;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.start[iVar13] = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.max
  [(this->
   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thedim] = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.len
  [(this->
   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thedim] = 0;
  iVar13 = (this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedim;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.list.idx = iVar13;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.start[iVar13] = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.max
  [(this->
   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thedim] = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.len
  [(this->
   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thedim] = 0;
  local_2d8 = &this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  pnVar4 = &this->lastThreshold;
  psVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances;
  b = &(this->minStability).m_backend;
  local_2e0 = b;
  while( true ) {
    (this->
    super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).stat = OK;
    local_e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 8);
    local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    local_e8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 2);
    local_e8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 4);
    local_e8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 6);
    local_e8.m_backend.exp = (this->lastThreshold).m_backend.exp;
    local_e8.m_backend.neg = (this->lastThreshold).m_backend.neg;
    local_e8.m_backend.fpclass = (this->lastThreshold).m_backend.fpclass;
    local_e8.m_backend.prec_elem = (this->lastThreshold).m_backend.prec_elem;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result,
               &psVar3->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar6 = Tolerances::epsilonFactorization((Tolerances *)result.m_backend.data._M_elems._0_8_);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_a0,RVar6,(type *)0x0);
    CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::factor(local_2d8,local_2d0,&local_e8,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result.m_backend.data._M_elems + 2));
    (*(this->
      super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SLinSolver[6])
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result,this);
    tVar9 = boost::multiprecision::operator>=
                      (&result,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)b);
    if (tVar9) break;
    uVar5 = *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 8);
    _local_2f8 = (undefined5)uVar5;
    uStack_2f3 = (undefined3)((ulong)uVar5 >> 0x28);
    local_318 = *(undefined1 (*) [8])(pnVar4->m_backend).data._M_elems;
    _Stack_310._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
          ((this->lastThreshold).m_backend.data._M_elems + 2);
    local_308._0_8_ = *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 4);
    uVar5 = *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 6);
    stack0xfffffffffffffd00 = (undefined5)uVar5;
    uStack_2fb = (undefined3)((ulong)uVar5 >> 0x28);
    iVar13 = (this->lastThreshold).m_backend.exp;
    bVar10 = (this->lastThreshold).m_backend.neg;
    fVar12 = (this->lastThreshold).m_backend.fpclass;
    iVar14 = (this->lastThreshold).m_backend.prec_elem;
    local_228 = *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    uStack_220 = *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 2);
    local_218 = *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 4);
    uStack_210 = *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 6);
    local_208 = *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 8);
    local_200 = iVar13;
    local_1fc = bVar10;
    local_1f8 = fVar12;
    local_1f4 = iVar14;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_2a0,
               &psVar3->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar6 = Tolerances::epsilon((Tolerances *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_));
    betterThreshold<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&result,(soplex *)&local_228,th_01,RVar6);
    *(ulong *)((this->lastThreshold).m_backend.data._M_elems + 8) =
         CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
    *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 4) =
         result.m_backend.data._M_elems._16_8_;
    *(ulong *)((this->lastThreshold).m_backend.data._M_elems + 6) =
         CONCAT35(result.m_backend.data._M_elems[7]._1_3_,result.m_backend.data._M_elems._24_5_);
    *(undefined8 *)(pnVar4->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 2) =
         result.m_backend.data._M_elems._8_8_;
    (this->lastThreshold).m_backend.exp = result.m_backend.exp;
    (this->lastThreshold).m_backend.neg = result.m_backend.neg;
    (this->lastThreshold).m_backend.fpclass = result.m_backend.fpclass;
    (this->lastThreshold).m_backend.prec_elem = result.m_backend.prec_elem;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2a0 + 8));
    local_248[1]._1_3_ = uStack_2f3;
    local_248._0_5_ = _local_2f8;
    auStack_250[1]._1_3_ = uStack_2fb;
    auStack_250._0_5_ = stack0xfffffffffffffd00;
    local_258[0] = local_308[0];
    local_258[1] = local_308[1];
    local_268 = (Tolerances *)local_318;
    p_Stack_260 = _Stack_310._M_pi;
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 2);
    local_128.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 6);
    local_128.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 8);
    local_128.m_backend.exp = (this->lastThreshold).m_backend.exp;
    local_128.m_backend.neg = (this->lastThreshold).m_backend.neg;
    local_128.m_backend.fpclass = (this->lastThreshold).m_backend.fpclass;
    local_128.m_backend.prec_elem = (this->lastThreshold).m_backend.prec_elem;
    local_240 = iVar13;
    local_23c = bVar10;
    local_238 = fVar12;
    local_234 = iVar14;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result,
               &psVar3->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar6 = Tolerances::epsilon((Tolerances *)result.m_backend.data._M_elems._0_8_);
    bVar10 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_268,&local_128,RVar6);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result.m_backend.data._M_elems + 2));
    b = local_2e0;
    if (bVar10) break;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0x40000000;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (local_2e0,(double *)&result);
    pSVar11 = (this->
              super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    if ((pSVar11 != (SPxOut *)0x0) && (4 < (int)pSVar11->m_verbosity)) {
      result.m_backend.data._M_elems[0] = pSVar11->m_verbosity;
      local_2a0._0_4_ = 5;
      (*pSVar11->_vptr_SPxOut[2])(pSVar11,local_2a0);
      pSVar11 = soplex::operator<<((this->
                                   super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).spxout,
                                   "ISLUFA01 refactorizing with increased Markowitz threshold: ");
      local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar4->m_backend).data._M_elems;
      local_168.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 2);
      local_168.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 4);
      local_168.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 6);
      local_168.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 8);
      local_168.m_backend.exp = (this->lastThreshold).m_backend.exp;
      local_168.m_backend.neg = (this->lastThreshold).m_backend.neg;
      local_168.m_backend.fpclass = (this->lastThreshold).m_backend.fpclass;
      local_168.m_backend.prec_elem = (this->lastThreshold).m_backend.prec_elem;
      pSVar11 = soplex::operator<<(pSVar11,&local_168);
      std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
      pSVar11 = (this->
                super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar11->_vptr_SPxOut[2])
                (pSVar11,(__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result);
    }
  }
  (*(this->
    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SLinSolver[6])(&result,this);
  return (this->
         super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).stat;
}

Assistant:

typename SLUFactor<R>::Status SLUFactor<R>::load(const SVectorBase<R>* matrix[], int dm)
{
   assert(dm     >= 0);
   assert(matrix != nullptr);

   R lastStability = stability();

   initDR(this->u.row.list);
   initDR(this->u.col.list);

   usetup        = false;
   this->l.updateType  = uptype;
   this->l.firstUpdate = 0;
   this->l.firstUnused = 0;

   if(dm != this->thedim)
   {
      clear();

      this->thedim = dm;
      vec.reDim(this->thedim);
      ssvec.reDim(this->thedim);
      eta.reDim(this->thedim);
      forest.reDim(this->thedim);
      this->work = vec.get_ptr();

      spx_realloc(this->row.perm, this->thedim);
      spx_realloc(this->row.orig, this->thedim);
      spx_realloc(this->col.perm, this->thedim);
      spx_realloc(this->col.orig, this->thedim);
      this->diag.resize(this->thedim);

      spx_realloc(this->u.row.elem,  this->thedim);
      spx_realloc(this->u.row.len,   this->thedim + 1);
      spx_realloc(this->u.row.max,   this->thedim + 1);
      spx_realloc(this->u.row.start, this->thedim + 1);

      spx_realloc(this->u.col.elem,  this->thedim);
      spx_realloc(this->u.col.len,   this->thedim + 1);
      spx_realloc(this->u.col.max,   this->thedim + 1);
      spx_realloc(this->u.col.start, this->thedim + 1);

      this->l.startSize = this->thedim + SOPLEX_MAXUPDATES;

      spx_realloc(this->l.row,   this->l.startSize);
      spx_realloc(this->l.start, this->l.startSize);
   }
   // the last factorization was reasonably stable, so we decrease the Markowitz threshold (stored in lastThreshold) in
   // order to favour sparsity
   else if(lastStability > 2.0 * minStability)
   {
      // we reset lastThreshold to its previous value in the sequence minThreshold, betterThreshold(minThreshold),
      // betterThreshold(betterThreshold(minThreshold)), ...
      R last   = minThreshold;
      R better = betterThreshold(last, this->tolerances()->epsilon());

      while(better < lastThreshold)
      {
         last   = better;
         better = betterThreshold(last, this->tolerances()->epsilon());
      }

      lastThreshold = last;

      // we reset the minimum stability (which might have been decreased below) to ensure that the increased sparsity
      // does not hurt the stability
      minStability  = 2 * SOPLEX_MINSTABILITY;
   }

   this->u.row.list.idx      = this->thedim;
   this->u.row.start[this->thedim] = 0;
   this->u.row.max[this->thedim]   = 0;
   this->u.row.len[this->thedim]   = 0;

   this->u.col.list.idx      = this->thedim;
   this->u.col.start[this->thedim] = 0;
   this->u.col.max[this->thedim]   = 0;
   this->u.col.len[this->thedim]   = 0;

   for(;;)
   {
      ///@todo if the factorization fails with stat = SINGULAR, distinuish between proven singularity (e.g., because of
      ///an empty column) and singularity due to numerics, that could be avoided by changing minStability and
      ///lastThreshold; in the first case, we want to abort, otherwise change the numerics
      this->stat = this->OK;
      this->factor(matrix, lastThreshold, this->tolerances()->epsilonFactorization());

      // finish if the factorization is stable
      if(stability() >= minStability)
         break;

      // otherwise, we increase the Markowitz threshold
      R x = lastThreshold;
      lastThreshold = betterThreshold(lastThreshold, this->tolerances()->epsilon());

      // until it doesn't change anymore at its maximum value
      if(EQ(x, lastThreshold, this->tolerances()->epsilon()))
         break;

      // we relax the stability requirement
      minStability /= 2.0;

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                    "ISLUFA01 refactorizing with increased Markowitz threshold: "
                    << lastThreshold << std::endl;)
   }

   SPxOut::debug(this, "DSLUFA02 threshold = {} \tstability = {}\tminStability = {}\n", lastThreshold,
                 stability(), minStability);
   SPX_DEBUG(
   {
      int i;
      FILE* fl = fopen("dump.lp", "w");
      std::cout << "DSLUFA03 Basis:\n";
      int j = 0;

      for(i = 0; i < dim(); ++i)
         j += matrix[i]->size();
      for(i = 0; i < dim(); ++i)
      {
         for(j = 0; j < matrix[i]->size(); ++j)
         {
            fprintf(fl, "%8d  %8d  ",
                    i + 1, matrix[i]->index(j) + 1);
            std::cout << matrix[i]->value(j) << std::endl;
         }
      }
      fclose(fl);
      std::cout << "DSLUFA04 LU-Factors:" << std::endl;
      dump();

      std::cout << "DSLUFA05 threshold = " << lastThreshold
                << "\tstability = " << stability() << std::endl;
   }
   )

   assert(isConsistent());
   return Status(this->stat);
}